

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<ImplDispatchTest_AEAD_AES_GCM_Test>::CreateTest
          (TestFactoryImpl<ImplDispatchTest_AEAD_AES_GCM_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x18);
  ImplDispatchTest_AEAD_AES_GCM_Test::ImplDispatchTest_AEAD_AES_GCM_Test
            ((ImplDispatchTest_AEAD_AES_GCM_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }